

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O2

Ops * __thiscall Typelib::MemoryLayout::simplifyInit(Ops *__return_storage_ptr__,MemoryLayout *this)

{
  const_iterator cVar1;
  InvalidMemoryLayout *this_00;
  allocator local_79;
  string local_78;
  MemoryLayout result;
  
  result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar1 = simplifyInit(this,(const_iterator)
                            (this->init_ops).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (const_iterator)
                       (this->init_ops).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&result,true);
  if (cVar1._M_current ==
      (this->init_ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((((long)result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) &&
        (result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start)) &&
       (*result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start == 3)) {
      result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           result.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,&result.init_ops);
    ~MemoryLayout(&result);
    return __return_storage_ptr__;
  }
  this_00 = (InvalidMemoryLayout *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_78,"simplifyInit() did not reach the end",&local_79)
  ;
  InvalidMemoryLayout::InvalidMemoryLayout(this_00,&local_78);
  __cxa_throw(this_00,&InvalidMemoryLayout::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MemoryLayout::Ops MemoryLayout::simplifyInit() const
{
    MemoryLayout result;
    const_iterator end = simplifyInit(init_begin(), init_end(), result, true);
    if (end != init_end())
        throw InvalidMemoryLayout("simplifyInit() did not reach the end");

    MemoryLayout::Ops& simplified = result.init_ops;
    if (simplified.size() == 2 && simplified[0] == FLAG_INIT_SKIP)
        simplified.clear();
    return simplified;
}